

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.cc
# Opt level: O0

S2CellId * __thiscall S2CellId::ToString_abi_cxx11_(S2CellId *this)

{
  bool bVar1;
  int iVar2;
  uint64 v;
  S2CellId *in_RSI;
  int local_f4;
  undefined1 local_f0 [4];
  int current_level;
  AlphaNum local_c0;
  undefined1 local_89;
  Hex local_88;
  AlphaNum local_78;
  AlphaNum local_48;
  S2CellId *this_local;
  string *out;
  
  this_local = this;
  bVar1 = is_valid(in_RSI);
  if (bVar1) {
    local_89 = 0;
    iVar2 = face(in_RSI);
    absl::AlphaNum::AlphaNum(&local_c0,iVar2);
    absl::AlphaNum::AlphaNum((AlphaNum *)local_f0,"/");
    absl::StrCat_abi_cxx11_((absl *)this,&local_c0,(AlphaNum *)local_f0);
    for (local_f4 = 1; iVar2 = level(in_RSI), local_f4 <= iVar2; local_f4 = local_f4 + 1) {
      iVar2 = child_position(in_RSI,local_f4);
      std::__cxx11::string::operator+=((string *)this,"0123"[iVar2]);
    }
  }
  else {
    absl::AlphaNum::AlphaNum(&local_48,"Invalid: ");
    v = id(in_RSI);
    absl::Hex::Hex<unsigned_long_long>(&local_88,v,kZeroPad16,(type *)0x0);
    absl::AlphaNum::AlphaNum(&local_78,local_88);
    absl::StrCat_abi_cxx11_((absl *)this,&local_48,&local_78);
  }
  return this;
}

Assistant:

string S2CellId::ToString() const {
  if (!is_valid()) {
    return StrCat("Invalid: ", absl::Hex(id(), absl::kZeroPad16));
  }
  string out = StrCat(face(), "/");
  for (int current_level = 1; current_level <= level(); ++current_level) {
    // Avoid dependencies of SimpleItoA, and slowness of StrAppend &
    // std::to_string.
    out += "0123"[child_position(current_level)];
  }
  return out;
}